

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_PrimitiveBatchV(GPU_Image *image,GPU_Target *target,GPU_PrimitiveEnum primitive_type,
                        unsigned_short num_vertices,void *values,uint num_indices,
                        unsigned_short *indices,GPU_BatchFlagEnum flags)

{
  GPU_Target *pGVar1;
  char *pcVar2;
  GPU_ErrorEnum GStack_50;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    pcVar2 = "NULL renderer";
  }
  else {
    pGVar1 = _gpu_current_renderer->current_context_target;
    if (target == (GPU_Target *)0x0 || pGVar1 != (GPU_Target *)0x0) {
LAB_0015daed:
      if (pGVar1 != (GPU_Target *)0x0) {
        if (target != (GPU_Target *)0x0) {
          if (num_vertices != 0) {
            (*_gpu_current_renderer->impl->PrimitiveBatchV)
                      (_gpu_current_renderer,image,target,primitive_type,num_vertices,values,
                       num_indices,indices,flags);
          }
          return;
        }
        pcVar2 = "target";
        GStack_50 = GPU_ERROR_NULL_ARGUMENT;
        goto LAB_0015db58;
      }
    }
    else if (target->context != (GPU_Context *)0x0) {
      GPU_MakeCurrent(target,target->context->windowID);
      pGVar1 = _gpu_current_renderer->current_context_target;
      goto LAB_0015daed;
    }
    pcVar2 = "NULL context";
  }
  GStack_50 = GPU_ERROR_USER_ERROR;
LAB_0015db58:
  GPU_PushErrorCode("GPU_PrimitiveBatchV",GStack_50,"%s",pcVar2);
  return;
}

Assistant:

void GPU_PrimitiveBatchV(GPU_Image* image, GPU_Target* target, GPU_PrimitiveEnum primitive_type, unsigned short num_vertices, void* values, unsigned int num_indices, unsigned short* indices, GPU_BatchFlagEnum flags)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    if(target == NULL)
        RETURN_ERROR(GPU_ERROR_NULL_ARGUMENT, "target");

    if(num_vertices == 0)
        return;


    _gpu_current_renderer->impl->PrimitiveBatchV(_gpu_current_renderer, image, target, primitive_type, num_vertices, values, num_indices, indices, flags);
}